

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# satIO.cpp
# Opt level: O0

bool write_exp_to_file(expression *exp,string *filename,bool terminal)

{
  byte bVar1;
  _Ios_Openmode _Var2;
  ostream *poVar3;
  ostream local_258 [8];
  ofstream outputfile;
  mathCore local_40 [7];
  bool success;
  string exp_as_string;
  bool terminal_local;
  string *filename_local;
  expression *exp_local;
  
  mathCore::as_string_abi_cxx11_(local_40,exp);
  if (terminal) {
    poVar3 = std::operator<<((ostream *)&std::cout,"\n\n\nOutputExpression:\n");
    poVar3 = std::operator<<(poVar3,(string *)local_40);
    std::operator<<(poVar3,"\n\n\n");
  }
  _Var2 = std::operator|(_S_out,_S_app);
  std::ofstream::ofstream(local_258,(string *)filename,_Var2);
  poVar3 = std::operator<<(local_258,(string *)local_40);
  std::operator<<(poVar3,"\n\n\n");
  bVar1 = std::ios::good();
  std::ofstream::close();
  std::ofstream::~ofstream(local_258);
  std::__cxx11::string::~string((string *)local_40);
  return (bool)(bVar1 & 1);
}

Assistant:

bool write_exp_to_file(expression* exp, std::string& filename, bool terminal) {
  std::string exp_as_string = mathCore::as_string(exp);
  bool success;

  if (terminal) {
    std::cout << "\n\n\nOutputExpression:\n" << exp_as_string << "\n\n\n";
  }

  std::ofstream outputfile(filename, std::ios::out | std::ios::app);
  outputfile << exp_as_string << "\n\n\n";
  success = outputfile.good();
  outputfile.close();
  return success;
}